

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqReqRep.cpp
# Opt level: O0

shared_ptr<std::vector<char,_std::allocator<char>_>_> __thiscall
adios2::zmq::ZmqReqRep::ReceiveRequest(ZmqReqRep *this)

{
  undefined8 uVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  char *__src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> sVar6;
  int bytes;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *request;
  nullptr_t in_stack_ffffffffffffffb8;
  element_type *this_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  uVar1 = *(undefined8 *)(in_RSI + 0x28);
  this_00 = in_RDI;
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0xdba6b7);
  sVar4 = std::vector<char,_std::allocator<char>_>::capacity
                    ((vector<char,_std::allocator<char>_> *)(in_RSI + 8));
  iVar2 = zmq_recv(uVar1,pcVar3,sVar4,0);
  if (iVar2 < 1) {
    std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr
              ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)this_00,
               in_stack_ffffffffffffffb8);
    _Var5._M_pi = extraout_RDX;
  }
  else {
    std::make_shared<std::vector<char,std::allocator<char>>,int&>
              ((int *)(CONCAT44(iVar2,in_stack_ffffffffffffffe8) & 0xffffffff00ffffff));
    std::
    __shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0xdba717);
    pcVar3 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0xdba71f);
    __src = std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0xdba731);
    memcpy(pcVar3,__src,(long)iVar2);
    _Var5._M_pi = extraout_RDX_00;
  }
  sVar6.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (shared_ptr<std::vector<char,_std::allocator<char>_>_>)
         sVar6.
         super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<char>> ZmqReqRep::ReceiveRequest()
{
    int bytes = zmq_recv(m_Socket, m_ReceiverBuffer.data(), m_ReceiverBuffer.capacity(), 0);
    if (bytes <= 0)
    {
        return nullptr;
    }
    auto request = std::make_shared<std::vector<char>>(bytes);
    std::memcpy(request->data(), m_ReceiverBuffer.data(), bytes);
    return request;
}